

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

void __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::ast::Type_*,_const_slang::ast::Type_*,_slang::Hasher<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Type_*>_>,_std::equal_to<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Type_*>_>,_std::allocator<const_slang::ast::Type_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>_>
::rehash(sherwood_v3_table<const_slang::ast::Type_*,_const_slang::ast::Type_*,_slang::Hasher<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Type_*>_>,_std::equal_to<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Type_*>_>,_std::allocator<const_slang::ast::Type_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>_>
         *this,size_t num_buckets)

{
  char max_lookups;
  EntryPointer begin;
  int8_t iVar1;
  size_t sVar2;
  ulong uVar3;
  sherwood_v3_entry<const_slang::ast::Type_*> *psVar4;
  long lVar5;
  byte bVar6;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::ast::Type_*>_3 *key;
  double dVar7;
  size_t local_38;
  
  local_38 = num_buckets;
  dVar7 = ceil((((double)CONCAT44(0x45300000,(int)(this->num_elements >> 0x20)) -
                1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this->num_elements) - 4503599627370496.0)) /
               (double)this->_max_load_factor);
  local_38 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 != 0) {
    iVar1 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
    sVar2 = this->num_slots_minus_one;
    if (sVar2 != 0) {
      sVar2 = sVar2 + 1;
    }
    if (local_38 != sVar2) {
      uVar3 = local_38 >> 1 | local_38;
      uVar3 = uVar3 >> 2 | uVar3;
      uVar3 = uVar3 >> 4 | uVar3;
      uVar3 = uVar3 >> 8 | uVar3;
      uVar3 = uVar3 >> 0x10 | uVar3;
      uVar3 = uVar3 >> 0x20 | uVar3;
      bVar6 = 4;
      if ('\x04' < (char)log2(unsigned_long)::table
                         [(uVar3 - (uVar3 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a]) {
        bVar6 = log2(unsigned_long)::table[(uVar3 - (uVar3 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
      }
      psVar4 = __gnu_cxx::new_allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>
               ::allocate((new_allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>
                           *)this,local_38 + bVar6,(void *)0x0);
      if (psVar4 != psVar4 + local_38 + ((ulong)bVar6 - 1)) {
        lVar5 = 0;
        do {
          (&psVar4->distance_from_desired)[lVar5] = -1;
          lVar5 = lVar5 + 0x10;
        } while (local_38 * 0x10 + (ulong)bVar6 * 0x10 + -0x10 != lVar5);
      }
      psVar4[local_38 + ((ulong)bVar6 - 1)].distance_from_desired = '\0';
      begin = this->entries;
      sVar2 = this->num_slots_minus_one;
      this->entries = psVar4;
      this->num_slots_minus_one = local_38;
      this->num_slots_minus_one = local_38 - 1;
      (this->hash_policy).shift = iVar1;
      max_lookups = this->max_lookups;
      this->max_lookups = bVar6;
      this->num_elements = 0;
      local_38 = sVar2;
      if (begin != begin + sVar2 + (long)max_lookups) {
        key = &begin->field_1;
        lVar5 = sVar2 * 0x10 + (long)max_lookups * 0x10;
        do {
          if (-1 < ((sherwood_v3_entry<const_slang::ast::Type_*> *)(key + -1))->
                   distance_from_desired) {
            sherwood_v3_table<slang::ast::Type_const*,slang::ast::Type_const*,slang::Hasher<slang::ast::Type_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Type_const*>>,std::equal_to<slang::ast::Type_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Type_const*>>,std::allocator<slang::ast::Type_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Type_const*>>>
            ::emplace<slang::ast::Type_const*>
                      ((sherwood_v3_table<slang::ast::Type_const*,slang::ast::Type_const*,slang::Hasher<slang::ast::Type_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Type_const*>>,std::equal_to<slang::ast::Type_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Type_const*>>,std::allocator<slang::ast::Type_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Type_const*>>>
                        *)this,&key->value);
            ((sherwood_v3_entry<const_slang::ast::Type_*> *)(key + -1))->distance_from_desired = -1;
          }
          key = key + 2;
          lVar5 = lVar5 + -0x10;
        } while (lVar5 != 0);
      }
      deallocate_data(this,begin,local_38,max_lookups);
    }
    return;
  }
  reset_to_empty_state(this);
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }